

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_write_op(sexp ctx,sexp self,sexp_sint_t n,sexp obj,sexp out)

{
  sexp psVar1;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  int *in_R8;
  sexp res;
  sexp_sint_t in_stack_000001b0;
  sexp in_stack_000001b8;
  sexp in_stack_000001c0;
  sexp in_stack_000001c8;
  sexp in_stack_fffffffffffffff8;
  
  if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0x11)) {
    sexp_maybe_block_output_port(in_stack_fffffffffffffff8,in_RDI);
    psVar1 = sexp_write_one(in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b0)
    ;
    sexp_maybe_unblock_port(in_RDX,in_RCX);
  }
  else {
    psVar1 = sexp_type_exception(in_RDI,in_RSI,(sexp_uint_t)in_RDX,in_RCX);
  }
  return psVar1;
}

Assistant:

sexp sexp_write_op (sexp ctx, sexp self, sexp_sint_t n, sexp obj, sexp out) {
  sexp res;
  sexp_assert_type(ctx, sexp_oportp, SEXP_OPORT, out);
#if SEXP_USE_GREEN_THREADS
  sexp_maybe_block_output_port(ctx, out);
#endif
  res = sexp_write_one(ctx, obj, out, 0);
#if SEXP_USE_GREEN_THREADS
  sexp_maybe_unblock_port(ctx, out);
#endif
  return res;
}